

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O0

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
webfront::http::Headers::getHeadersValues_abi_cxx11_(Headers *this,string_view headerName)

{
  string_view s1;
  bool bVar1;
  char *in_RCX;
  size_t in_RDX;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Header *header;
  const_iterator __end2;
  const_iterator __begin2;
  vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  *__range2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  string_view in_stack_ffffffffffffff88;
  __normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
  local_38 [2];
  undefined1 local_21;
  size_t local_18;
  char *pcStack_10;
  
  local_21 = 0;
  __x = in_RDI;
  local_18 = in_RDX;
  pcStack_10 = in_RCX;
  memset(in_RDI,0,0x18);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x12df26);
  local_38[0]._M_current =
       (Header *)
       std::
       vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>::
       begin((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>::
  end((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_> *)
      CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  while (bVar1 = __gnu_cxx::
                 operator==<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
                           ((__normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
    ::operator*(local_38);
    ::std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
    s1._M_str = pcStack_10;
    s1._M_len = local_18;
    in_stack_ffffffffffffff6f = caseInsensitiveEqual(s1,in_stack_ffffffffffffff88);
    if ((bool)in_stack_ffffffffffffff6f) {
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_RSI,__x);
    }
    __gnu_cxx::
    __normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
    ::operator++(local_38);
  }
  return (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

[[nodiscard]] std::list<std::string> getHeadersValues(std::string_view headerName) const {
        std::list<std::string> values{};
        for (auto& header : headers)
            if (caseInsensitiveEqual(header.name, headerName)) values.push_back(header.value);
        return values;
    }